

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprLHitGather(Fts3Expr *pExpr,MatchInfo *p)

{
  char cVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  Fts3Phrase *pFVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  u32 uVar8;
  uint uVar9;
  ulong in_RAX;
  ulong uVar10;
  char *pEnd;
  byte *pbVar11;
  int iVar12;
  int iCol;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  while( true ) {
    if (pExpr->bEof != '\0') {
      return 0;
    }
    if (pExpr->iDocid != p->pCursor->iPrevId) {
      return 0;
    }
    if (pExpr->pLeft == (Fts3Expr *)0x0) {
      psVar3 = (p->pCursor->base).pVtab;
      pFVar4 = pExpr->pPhrase;
      pbVar11 = (byte *)(pFVar4->doclist).pList;
      uStack_38 = uStack_38 & 0xffffffff;
      cVar1 = p->flag;
      iVar7 = p->nCol;
      if (cVar1 != 'y') {
        iVar12 = iVar7 + 0x3e;
        if (-1 < iVar7 + 0x1f) {
          iVar12 = iVar7 + 0x1f;
        }
        iVar7 = iVar12 >> 5;
      }
      iVar7 = iVar7 * pExpr->iPhrase;
      do {
        bVar2 = *pbVar11;
        uVar8 = 0;
        if (1 < bVar2) {
          uVar8 = 0;
          do {
            bVar5 = bVar2 & 0x80;
            uVar8 = uVar8 + (bVar2 >> 7 ^ 1);
            bVar2 = pbVar11[1];
            pbVar11 = pbVar11 + 1;
          } while ((bVar2 & 0xfe) != 0 || bVar5 != 0);
        }
        iVar12 = pFVar4->iColumn;
        if (iVar12 == uStack_38._4_4_ || *(int *)&psVar3[2].pModule <= iVar12) {
          if (cVar1 == 'y') {
            p->aMatchinfo[uStack_38._4_4_ + iVar7] = uVar8;
          }
          else if (uVar8 != 0) {
            iVar12 = uStack_38._4_4_ + 0x20;
            if (-1 < uStack_38._4_4_ + 1) {
              iVar12 = uStack_38._4_4_ + 1;
            }
            p->aMatchinfo[(iVar12 >> 5) + iVar7] =
                 p->aMatchinfo[(iVar12 >> 5) + iVar7] | 1 << ((byte)(uStack_38 >> 0x20) & 0x1f);
          }
        }
        cVar6 = '\x03';
        if (*pbVar11 == 1) {
          if ((char)pbVar11[1] < '\0') {
            uVar9 = sqlite3Fts3GetVarint32((char *)(pbVar11 + 1),(int *)((long)&uStack_38 + 4));
            uVar10 = (ulong)uVar9;
          }
          else {
            uStack_38 = CONCAT44((int)(char)pbVar11[1],(undefined4)uStack_38);
            uVar10 = 1;
          }
          pbVar11 = pbVar11 + 1 + uVar10;
          cVar6 = p->nCol <= uStack_38._4_4_;
        }
      } while (cVar6 == '\0');
      if (cVar6 == '\x03') {
        iVar7 = 0;
      }
      else {
        iVar7 = 0x10b;
      }
      return iVar7;
    }
    iVar7 = fts3ExprLHitGather(pExpr->pLeft,p);
    if (iVar7 != 0) break;
    pExpr = pExpr->pRight;
  }
  return iVar7;
}

Assistant:

static int fts3ExprLHitGather(
  Fts3Expr *pExpr,
  MatchInfo *p
){
  int rc = SQLITE_OK;
  assert( (pExpr->pLeft==0)==(pExpr->pRight==0) );
  if( pExpr->bEof==0 && pExpr->iDocid==p->pCursor->iPrevId ){
    if( pExpr->pLeft ){
      rc = fts3ExprLHitGather(pExpr->pLeft, p);
      if( rc==SQLITE_OK ) rc = fts3ExprLHitGather(pExpr->pRight, p);
    }else{
      rc = fts3ExprLHits(pExpr, p);
    }
  }
  return rc;
}